

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_clear_n1_set(avl_tree *set)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  n1_node *node_it;
  n1_node *current_node;
  avl_tree *set_local;
  
  plVar1 = (set->list_head).next;
  node_it = (n1_node *)&plVar1[-3].prev;
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-3].prev;
    if ((node_it->_avl_node).list.prev == (set->list_head).prev) break;
    avl_remove(set,&node_it->_avl_node);
    free(node_it);
    node_it = (n1_node *)__tempptr;
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
mpr_clear_n1_set(struct avl_tree *set) {
  struct n1_node *current_node, *node_it;

  avl_for_each_element_safe(set, current_node, _avl_node, node_it) {
    avl_remove(set, &current_node->_avl_node);
    free(current_node);
  }
}